

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::SwiftConstant_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,FieldDef *field)

{
  bool bVar1;
  bool bVar2;
  char *__s;
  allocator<char> local_39;
  byte local_38;
  allocator<char> local_37;
  byte local_36;
  allocator<char> local_35 [18];
  byte local_23;
  allocator<char> local_22;
  undefined1 local_21;
  FieldDef *local_20;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  string *default_value;
  
  local_21 = 0;
  local_20 = field;
  field_local = (FieldDef *)this;
  this_local = (SwiftGenerator *)__return_storage_ptr__;
  bVar1 = StringIsFlatbufferNan(&(field->value).constant);
  local_23 = 0;
  local_36 = 0;
  local_38 = 0;
  bVar2 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_23 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,".nan",&local_22);
  }
  else {
    bVar1 = StringIsFlatbufferPositiveInfinity(&(local_20->value).constant);
    if (bVar1) {
      std::allocator<char>::allocator();
      local_36 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,".infinity",local_35);
    }
    else {
      bVar1 = StringIsFlatbufferNegativeInfinity(&(local_20->value).constant);
      if (bVar1) {
        std::allocator<char>::allocator();
        local_38 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"-.infinity",&local_37);
      }
      else {
        bVar1 = IsBool((local_20->value).type.base_type);
        if (bVar1) {
          bVar2 = std::operator==("0",&(local_20->value).constant);
          __s = "true";
          if (bVar2) {
            __s = "false";
          }
          std::allocator<char>::allocator();
          bVar2 = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,__s,&local_39);
        }
        else {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,(string *)&(local_20->value).constant);
        }
      }
    }
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_39);
  }
  if ((local_38 & 1) != 0) {
    std::allocator<char>::~allocator(&local_37);
  }
  if ((local_36 & 1) != 0) {
    std::allocator<char>::~allocator(local_35);
  }
  if ((local_23 & 1) != 0) {
    std::allocator<char>::~allocator(&local_22);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SwiftConstant(const FieldDef &field) {
    const auto default_value =
        StringIsFlatbufferNan(field.value.constant)                ? ".nan"
        : StringIsFlatbufferPositiveInfinity(field.value.constant) ? ".infinity"
        : StringIsFlatbufferNegativeInfinity(field.value.constant)
            ? "-.infinity"
        : IsBool(field.value.type.base_type)
            ? ("0" == field.value.constant ? "false" : "true")
            : field.value.constant;
    return default_value;
  }